

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertDup(sqlite3 *db,Upsert *p)

{
  ExprList *pTarget;
  Expr *pTargetWhere;
  ExprList *pSet;
  Expr *pWhere;
  Upsert *p_local;
  sqlite3 *db_local;
  
  if (p == (Upsert *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    pTarget = sqlite3ExprListDup(db,p->pUpsertTarget,0);
    pTargetWhere = sqlite3ExprDup(db,p->pUpsertTargetWhere,0);
    pSet = sqlite3ExprListDup(db,p->pUpsertSet,0);
    pWhere = sqlite3ExprDup(db,p->pUpsertWhere,0);
    db_local = (sqlite3 *)sqlite3UpsertNew(db,pTarget,pTargetWhere,pSet,pWhere);
  }
  return (Upsert *)db_local;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertDup(sqlite3 *db, Upsert *p){
  if( p==0 ) return 0;
  return sqlite3UpsertNew(db,
           sqlite3ExprListDup(db, p->pUpsertTarget, 0),
           sqlite3ExprDup(db, p->pUpsertTargetWhere, 0),
           sqlite3ExprListDup(db, p->pUpsertSet, 0),
           sqlite3ExprDup(db, p->pUpsertWhere, 0)
         );
}